

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pretty-format.c
# Opt level: O0

int32_t rtosc_convert_to_range
                  (rtosc_arg_val_t *arg,size_t size,rtosc_arg_val_t *arg_out,
                  rtosc_print_options *opt)

{
  char cVar1;
  int iVar2;
  int iVar3;
  char *pcVar4;
  size_t sVar5;
  long in_RCX;
  long in_RDX;
  ulong in_RSI;
  char *in_RDI;
  rtosc_arg_val_t *old_arg_out;
  size_t next;
  int go_on;
  rtosc_arg_val_t added;
  rtosc_arg_val_t delta;
  int has_delta;
  int32_t skipped;
  size_t i;
  size_t num_common;
  char type;
  undefined4 in_stack_ffffffffffffff38;
  int32_t in_stack_ffffffffffffff3c;
  rtosc_arg_val_t *in_stack_ffffffffffffff40;
  rtosc_arg_val_t *in_stack_ffffffffffffff48;
  char *pcVar6;
  rtosc_arg_val_t *in_stack_ffffffffffffff70;
  ulong in_stack_ffffffffffffff78;
  uint in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff84;
  undefined4 in_stack_ffffffffffffff88;
  int32_t in_stack_ffffffffffffff8c;
  undefined8 in_stack_ffffffffffffff90;
  int in_stack_ffffffffffffffa0;
  int local_48;
  int local_44;
  ulong local_40;
  ulong local_38;
  int32_t local_4;
  
  if (((in_RSI < 5) || (*in_RDI == '-')) || (*(int *)(in_RCX + 0x14) == 0)) {
    local_4 = 0;
  }
  else {
    cVar1 = *in_RDI;
    local_38 = 0;
    for (local_40 = 0; (local_40 < in_RSI && (cVar1 == in_RDI[local_40 * 0x18]));
        local_40 = sVar5 + local_40) {
      sVar5 = incsize(in_stack_ffffffffffffff40);
      local_38 = local_38 + 1;
    }
    if (local_38 < 5) {
      local_4 = 0;
    }
    else {
      local_38 = 1;
      pcVar6 = in_RDI;
      incsize(in_stack_ffffffffffffff40);
      iVar2 = rtosc_arg_vals_eq_single
                        ((rtosc_arg_val_t *)in_stack_ffffffffffffff90,
                         (rtosc_arg_val_t *)
                         CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),
                         (rtosc_cmp_options *)
                         CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80));
      if (iVar2 == 0) {
        pcVar4 = numeric_range_convertible_types();
        pcVar4 = strchr(pcVar4,(int)*in_RDI);
        if (pcVar4 == (char *)0x0) {
          return 0;
        }
        local_48 = 1;
        rtosc_arg_val_sub(in_stack_ffffffffffffff48,in_stack_ffffffffffffff40,
                          (rtosc_arg_val_t *)
                          CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
      }
      else {
        local_48 = 0;
      }
      iVar2 = 1;
      sVar5 = incsize(in_stack_ffffffffffffff40);
      local_44 = (int)sVar5;
      while (iVar2 != 0) {
        sVar5 = incsize(in_stack_ffffffffffffff40);
        in_stack_ffffffffffffff78 = (long)local_44 + sVar5;
        if (local_48 != 0) {
          rtosc_arg_val_add((rtosc_arg_val_t *)(in_RDI + (long)local_44 * 0x18),
                            (rtosc_arg_val_t *)&stack0xffffffffffffffa0,
                            (rtosc_arg_val_t *)&stack0xffffffffffffff88);
        }
        if ((in_RSI <= in_stack_ffffffffffffff78) ||
           (iVar3 = rtosc_arg_vals_eq_single
                              ((rtosc_arg_val_t *)in_stack_ffffffffffffff90,
                               (rtosc_arg_val_t *)
                               CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),
                               (rtosc_cmp_options *)CONCAT44(iVar2,in_stack_ffffffffffffff80)),
           iVar3 == 0)) {
          iVar2 = 0;
        }
        local_44 = (int)in_stack_ffffffffffffff78;
        local_38 = local_38 + 1;
      }
      if (local_38 < 5) {
        local_4 = 0;
      }
      else {
        insert_arg_range((rtosc_arg_val_t *)in_stack_ffffffffffffff90,in_stack_ffffffffffffff8c,
                         (rtosc_arg_val_t *)(ulong)in_stack_ffffffffffffff80,
                         (int)(in_stack_ffffffffffffff78 >> 0x20),in_stack_ffffffffffffff70,
                         (int)((ulong)pcVar6 >> 0x20),in_stack_ffffffffffffffa0);
        sVar5 = incsize(in_stack_ffffffffffffff40);
        *(undefined1 *)(sVar5 * 0x18 + in_RDX + (long)(local_48 + 1) * 0x18) = 0x20;
        rtosc_av_arr_len_set(in_stack_ffffffffffffff40,in_stack_ffffffffffffff3c);
        local_4 = local_44;
      }
    }
  }
  return local_4;
}

Assistant:

static int32_t rtosc_convert_to_range(const rtosc_arg_val_t* const arg,
                                      size_t size,
                                      rtosc_arg_val_t* arg_out,
                                      const rtosc_print_options* opt)
{
    if(size < range_min || arg[0].type == '-' || !opt->compress_ranges)
        return 0;
    char type = arg->type;
    size_t num_common = 0;
    for(size_t i = 0; i < size; i += incsize(arg+i), ++num_common)
    {
        if(type != arg[i].type)
            break;
    }
    if(num_common < range_min)
        return 0;

    int32_t skipped;
    num_common = 1;
    int has_delta;
    rtosc_arg_val_t delta, added;

    if(rtosc_arg_vals_eq_single(arg, arg + incsize(arg), NULL))
        has_delta = 0;
    else if(strchr(numeric_range_convertible_types(), arg->type)) {
        has_delta = 1;
        rtosc_arg_val_sub(arg+1, arg, &delta);
    }
    else return 0;

    {
        int go_on = 1;
        size_t next;
        for(skipped = incsize(arg); go_on; skipped = next, ++num_common)
        {
            next = skipped + incsize(arg+skipped);

            if(has_delta)
                rtosc_arg_val_add(arg+skipped, &delta, &added);

            if(next >= size || !rtosc_arg_vals_eq_single(has_delta ? &added
                                                                   : arg,
                                                         arg+next, NULL))
                go_on = false;
        }
    }

    if(num_common >= range_min)
    {
        insert_arg_range(arg_out, num_common, arg, has_delta, &delta,
                         false, false);
        const rtosc_arg_val_t* old_arg_out = arg_out;
        arg_out += 1 + has_delta;
        arg_out += incsize(arg);
        arg_out->type = ' ';
        rtosc_av_arr_len_set(arg_out, skipped - (arg_out - old_arg_out) - 1);
        return skipped;
    }
    else
        return 0;
}